

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

int AF_AWeapon_CheckAmmo
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int fireMode;
  int iVar1;
  int iVar2;
  AWeapon *this;
  VMValue *pVVar3;
  bool bVar4;
  bool local_53;
  int local_4c;
  int u;
  int ammocnt;
  bool require;
  bool autoswitch;
  int mode;
  AWeapon *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2ae,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2ae,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AWeapon *)(param->field_0).field_1.a;
  local_53 = true;
  if (this != (AWeapon *)0x0) {
    local_53 = DObject::IsKindOf((DObject *)this,AWeapon::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AWeapon))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2ae,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2af,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2af,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  fireMode = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b0,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b0,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  iVar1 = param[2].field_0.i;
  if (numparam < 4) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar3->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b1,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    iVar2 = (pVVar3->field_0).i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b1,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[3].field_0.i;
  }
  u._2_1_ = iVar2 != 0;
  if (numparam < 5) {
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar3->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b2,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    local_4c = (pVVar3->field_0).i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b2,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_4c = param[4].field_0.i;
  }
  bVar4 = AWeapon::CheckAmmo(this,fireMode,iVar1 != 0,u._2_1_,local_4c);
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b3,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar4);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, CheckAmmo)
{
	PARAM_SELF_PROLOGUE(AWeapon);
	PARAM_INT(mode);
	PARAM_BOOL(autoswitch);
	PARAM_BOOL_DEF(require);
	PARAM_INT_DEF(ammocnt);
	ACTION_RETURN_BOOL(self->CheckAmmo(mode, autoswitch, require, ammocnt));
}